

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  reference pbVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  pointer pcVar6;
  string *psVar7;
  reference this_00;
  pointer this_01;
  ostream *poVar8;
  pointer ppVar9;
  cmMakefile *this_02;
  type os_00;
  char *pcVar10;
  reference pvVar11;
  mapped_type *pmVar12;
  undefined8 in_R8;
  undefined1 auVar13 [16];
  string_view sVar14;
  byte local_919;
  byte local_8f9;
  allocator<char> local_8c9;
  key_type local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  string local_880;
  allocator<char> local_859;
  key_type local_858;
  allocator<char> local_831;
  string local_830;
  string local_810;
  string local_7f0 [32];
  reference local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string local_7a8;
  undefined1 local_788 [8];
  cmNinjaBuild build;
  string local_638;
  cmAlphaNum local_618;
  string local_5e8;
  cmAlphaNum local_5c8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  undefined1 local_550 [8];
  cmNinjaRule rule;
  string local_418;
  string *local_3f8;
  string *acf;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  _Self local_3d0;
  iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmGeneratedFileStream fout;
  _Self local_130;
  _Self local_128;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_f8 [7];
  bool empty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmAlphaNum local_b0;
  undefined1 local_80 [8];
  string cleanScriptAbs;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string cleanScriptRel;
  value_type *lgr;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  cleanScriptRel.field_2._8_8_ =
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::at(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"CMakeFiles/clean_additional.cmake",&local_49);
  std::allocator<char>::~allocator(&local_49);
  pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                      cleanScriptRel.field_2._8_8_);
  psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar6);
  cmAlphaNum::cmAlphaNum(&local_b0,psVar7);
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,'/');
  cmStrCat<std::__cxx11::string>
            ((string *)local_80,&local_b0,
             (cmAlphaNum *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  this_00 = std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,0)
  ;
  this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,this_01,IncludeEmptyConfig);
  bVar4 = true;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f8);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f8);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&config);
    if (!bVar2) {
LAB_0039547a:
      if (bVar4) {
        cmsys::SystemTools::RemoveFile((string *)local_80);
        this_local._7_1_ = 0;
        fout._612_4_ = 1;
      }
      else {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&__range1_1,(string *)local_80,false,None);
        bVar3 = std::ios::operator!((ios *)((long)&__range1_1 +
                                           (long)__range1_1[-1].
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
        if ((bVar3 & 1) == 0) {
          std::operator<<((ostream *)&__range1_1,
                          "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n");
          __end1_1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_f8);
          config_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_f8);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end1_1,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&config_1), bVar4) {
            it_1._M_node = (_Base_ptr)
                           __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&__end1_1);
            local_3d0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                 ::find(&this->Configs,(key_type *)it_1._M_node);
            __range3 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                          ::end(&this->Configs);
            bVar4 = std::operator!=(&local_3d0,(_Self *)&__range3);
            local_919 = 0;
            if (bVar4) {
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
                       ::operator->(&local_3d0);
              bVar4 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty(&(ppVar9->second).AdditionalCleanFiles);
              local_919 = bVar4 ^ 0xff;
            }
            if ((local_919 & 1) != 0) {
              poVar8 = std::operator<<((ostream *)&__range1_1,
                                       "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
                                      );
              poVar8 = std::operator<<(poVar8,(string *)it_1._M_node);
              std::operator<<(poVar8,"\")\n");
              std::operator<<((ostream *)&__range1_1,"  file(REMOVE_RECURSE\n");
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
                       ::operator->(&local_3d0);
              __end3 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&(ppVar9->second).AdditionalCleanFiles);
              acf = (string *)
                    std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(&(ppVar9->second).AdditionalCleanFiles);
              while (bVar4 = std::operator!=(&__end3,(_Self *)&acf), bVar4) {
                local_3f8 = std::
                            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&__end3);
                poVar8 = std::operator<<((ostream *)&__range1_1,"  ");
                psVar7 = ConvertToNinjaPath(this,local_3f8);
                auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7)
                ;
                sVar14._M_len = auVar13._8_8_;
                rule._288_8_ = auVar13._0_8_;
                sVar14._M_str = (char *)0x0;
                cmOutputConverter::EscapeForCMake_abi_cxx11_
                          (&local_418,(cmOutputConverter *)rule._288_8_,sVar14,(WrapQuotes)in_R8);
                poVar8 = std::operator<<(poVar8,(string *)&local_418);
                std::operator<<(poVar8,'\n');
                std::__cxx11::string::~string((string *)&local_418);
                std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end3);
              }
              std::operator<<((ostream *)&__range1_1,"  )\n");
              std::operator<<((ostream *)&__range1_1,"endif()\n");
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1_1);
          }
          fout._612_4_ = 0;
        }
        else {
          this_local._7_1_ = 0;
          fout._612_4_ = 1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1_1);
        if (fout._612_4_ == 0) {
          pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                   operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                               *)cleanScriptRel.field_2._8_8_);
          this_02 = cmLocalGenerator::GetMakefile(pcVar6);
          cmMakefile::AddCMakeOutputFile(this_02,(string *)local_80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_570,"CLEAN_ADDITIONAL",&local_571);
          cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_550,&local_570);
          std::__cxx11::string::~string((string *)&local_570);
          std::allocator<char>::~allocator(&local_571);
          CMakeCmd_abi_cxx11_(&local_5e8,this);
          cmAlphaNum::cmAlphaNum(&local_5c8,&local_5e8);
          cmAlphaNum::cmAlphaNum(&local_618," -DCONFIG=$CONFIG -P ");
          pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                   operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                               *)cleanScriptRel.field_2._8_8_);
          NinjaOutputPath((string *)((long)&build.RspFile.field_2 + 8),this,(string *)local_48);
          sVar14 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(build.RspFile.field_2._M_local_buf + 8));
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_638,&pcVar6->super_cmOutputConverter,sVar14,SHELL);
          cmStrCat<std::__cxx11::string>(&local_598,&local_5c8,&local_618,&local_638);
          std::__cxx11::string::operator=
                    ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_598);
          std::__cxx11::string::~string((string *)&local_598);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)(build.RspFile.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::operator=
                    ((string *)(rule.Command.field_2._M_local_buf + 8),
                     "Cleaning additional files...");
          std::__cxx11::string::operator=
                    ((string *)(rule.Description.field_2._M_local_buf + 8),
                     "Rule for cleaning additional files.");
          os_00 = std::
                  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
                  operator*(&this->RulesFileStream);
          WriteRule((ostream *)os_00,(cmNinjaRule *)local_550);
          cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_550);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7a8,"CLEAN_ADDITIONAL",
                     (allocator<char> *)((long)&__range1_2 + 7));
          cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_788,&local_7a8);
          std::__cxx11::string::~string((string *)&local_7a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
          std::__cxx11::string::operator=((string *)local_788,"Clean additional files.");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&build.Rule.field_2 + 8));
          __end1_2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_f8);
          config_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_f8);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end1_2,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&config_2), bVar4) {
            local_7d0 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end1_2);
            pcVar10 = GetAdditionalCleanTargetName(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_830,pcVar10,&local_831);
            NinjaOutputPath(&local_810,this,&local_830);
            (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x48])(local_7f0,this,&local_810);
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&build.Rule.field_2 + 8));
            std::__cxx11::string::operator=((string *)pvVar11,local_7f0);
            std::__cxx11::string::~string(local_7f0);
            std::__cxx11::string::~string((string *)&local_810);
            std::__cxx11::string::~string((string *)&local_830);
            std::allocator<char>::~allocator(&local_831);
            pbVar1 = local_7d0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_858,"CONFIG",&local_859);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&build.OrderOnlyDeps.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_858
                                  );
            std::__cxx11::string::operator=((string *)pmVar12,(string *)pbVar1);
            std::__cxx11::string::~string((string *)&local_858);
            std::allocator<char>::~allocator(&local_859);
            WriteBuild(this,os,(cmNinjaBuild *)local_788,0,(bool *)0x0);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1_2);
          }
          uVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x26])();
          if ((uVar5 & 1) != 0) {
            pcVar10 = GetAdditionalCleanTargetName(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8a0,pcVar10,&local_8a1);
            NinjaOutputPath(&local_880,this,&local_8a0);
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&build.Rule.field_2 + 8));
            std::__cxx11::string::operator=((string *)pvVar11,(string *)&local_880);
            std::__cxx11::string::~string((string *)&local_880);
            std::__cxx11::string::~string((string *)&local_8a0);
            std::allocator<char>::~allocator(&local_8a1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8c8,"CONFIG",&local_8c9);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&build.OrderOnlyDeps.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_8c8
                                  );
            std::__cxx11::string::operator=((string *)pmVar12,"");
            std::__cxx11::string::~string((string *)&local_8c8);
            std::allocator<char>::~allocator(&local_8c9);
            WriteBuild(this,os,(cmNinjaBuild *)local_788,0,(bool *)0x0);
          }
          cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_788);
          this_local._7_1_ = 1;
          fout._612_4_ = 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_48);
      return (bool)(this_local._7_1_ & 1);
    }
    it._M_node = (_Base_ptr)
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
    local_128._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
         ::find(&this->Configs,(key_type *)it._M_node);
    local_130._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
         ::end(&this->Configs);
    bVar2 = std::operator!=(&local_128,&local_130);
    local_8f9 = 0;
    if (bVar2) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>
               ::operator->(&local_128);
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&(ppVar9->second).AdditionalCleanFiles);
      local_8f9 = bVar2 ^ 0xff;
    }
    if ((local_8f9 & 1) != 0) {
      bVar4 = false;
      goto LAB_0039547a;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  const auto& lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs =
    cmStrCat(lgr->GetBinaryDirectory(), '/', cleanScriptRel);
  std::vector<std::string> configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Check if there are additional files to clean
  bool empty = true;
  for (auto const& config : configs) {
    auto const it = this->Configs.find(config);
    if (it != this->Configs.end() &&
        !it->second.AdditionalCleanFiles.empty()) {
      empty = false;
      break;
    }
  }
  if (empty) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n";
    for (auto const& config : configs) {
      auto const it = this->Configs.find(config);
      if (it != this->Configs.end() &&
          !it->second.AdditionalCleanFiles.empty()) {
        fout << "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
             << config << "\")\n";
        fout << "  file(REMOVE_RECURSE\n";
        for (std::string const& acf : it->second.AdditionalCleanFiles) {
          fout << "  "
               << cmOutputConverter::EscapeForCMake(
                    this->ConvertToNinjaPath(acf))
               << '\n';
        }
        fout << "  )\n";
        fout << "endif()\n";
      }
    }
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = cmStrCat(
      this->CMakeCmd(), " -DCONFIG=$CONFIG -P ",
      lgr->ConvertToOutputFormat(this->NinjaOutputPath(cleanScriptRel),
                                 cmOutputConverter::SHELL));
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.emplace_back();
    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()), config);
      build.Variables["CONFIG"] = config;
      this->WriteBuild(os, build);
    }
    if (this->IsMultiConfig()) {
      build.Outputs.front() =
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName());
      build.Variables["CONFIG"] = "";
      this->WriteBuild(os, build);
    }
  }
  // Return success
  return true;
}